

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<14,_2,_9,_2,_9>::evaluate
               (ShaderEvalContext *evalCtx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int i;
  float *pfVar4;
  long lVar5;
  int row;
  long lVar6;
  long lVar7;
  undefined4 uVar8;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Mat3 m;
  Mat3 m_1;
  Vec4 *local_b0;
  undefined8 local_a8;
  float local_a0 [6];
  Matrix<float,_3,_3> local_88;
  Matrix<float,_3,_3> local_5c;
  Matrix<float,_3,_3> local_38;
  
  pfVar4 = (float *)&local_88;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar5 != lVar7) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)pfVar4 + lVar7) = uVar8;
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x24);
    lVar6 = lVar6 + 1;
    pfVar4 = pfVar4 + 1;
    lVar5 = lVar5 + 0xc;
  } while (lVar6 != 3);
  uVar1 = *(undefined8 *)evalCtx->in[0].m_data;
  local_88.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
  local_88.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
  local_88.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
  pfVar4 = evalCtx->in[1].m_data + 1;
  uVar2 = *(undefined8 *)pfVar4;
  local_88.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)pfVar4;
  uVar3 = *(undefined8 *)evalCtx->in[2].m_data;
  local_88.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  local_88.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  pfVar4 = (float *)&local_38;
  lVar5 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar5 != lVar7) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)pfVar4 + lVar7) = uVar8;
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x24);
    lVar6 = lVar6 + 1;
    pfVar4 = pfVar4 + 1;
    lVar5 = lVar5 + 0xc;
  } while (lVar6 != 3);
  local_38.m_data.m_data[1].m_data[0] = local_88.m_data.m_data[1].m_data[0];
  local_38.m_data.m_data[0].m_data[2] = local_88.m_data.m_data[0].m_data[2];
  local_38.m_data.m_data[0].m_data._0_8_ = uVar1;
  local_38.m_data.m_data[1].m_data._4_8_ = uVar2;
  local_38.m_data.m_data[2].m_data._0_8_ = uVar3;
  local_38.m_data.m_data[2].m_data[2] = local_88.m_data.m_data[2].m_data[2];
  tcu::operator/(&local_5c,&local_88,&local_38);
  local_a8 = (ulong)local_a8._4_4_ << 0x20;
  local_b0 = (Vec4 *)0x0;
  lVar5 = 0;
  do {
    *(float *)((long)&local_b0 + lVar5 * 4) =
         local_5c.m_data.m_data[0].m_data[lVar5] + local_5c.m_data.m_data[1].m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_a0[4] = 0.0;
  local_a0[2] = 0.0;
  local_a0[3] = 0.0;
  lVar5 = 0;
  do {
    local_a0[lVar5 + 2] =
         *(float *)((long)&local_b0 + lVar5 * 4) +
         *(float *)((long)(local_38.m_data.m_data + -1) + lVar5 * 4);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_b0 = &evalCtx->color;
  local_a8 = 0x100000000;
  local_a0[0] = 2.8026e-45;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_b0 + lVar5 * 4)] = local_a0[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) / getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}